

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

ChannelList *
Imf_3_4::channelInAllViews(string *channelName,ChannelList *channelList,StringVector *multiView)

{
  undefined1 uVar1;
  bool bVar2;
  const_iterator this;
  allocator<char> *__a;
  ChannelList *in_RDI;
  StringVector *in_stack_00000038;
  string *in_stack_00000040;
  string *in_stack_00000048;
  ConstIterator i;
  ChannelList *q;
  Channel *in_stack_000001d0;
  char *in_stack_000001d8;
  ChannelList *in_stack_000001e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  Channel *in_stack_ffffffffffffff30;
  bool local_a2;
  undefined7 in_stack_ffffffffffffff68;
  allocator<char> local_69;
  string local_68 [32];
  const_iterator local_48;
  const_iterator local_30;
  undefined1 local_21;
  
  local_21 = 0;
  ChannelList::ChannelList((ChannelList *)0x213bd1);
  local_30._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffff28);
  while( true ) {
    this._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffff28);
    local_48._M_node = this._M_node;
    uVar1 = operator!=((ConstIterator *)in_stack_ffffffffffffff30,
                       (ConstIterator *)in_stack_ffffffffffffff28);
    if (!(bool)uVar1) break;
    __a = (allocator<char> *)ChannelList::ConstIterator::name((ConstIterator *)0x213c52);
    bVar2 = std::operator==((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_a2 = true;
    if (!bVar2) {
      ChannelList::ConstIterator::name((ConstIterator *)0x213c8f);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_node,
                 (char *)CONCAT17(uVar1,in_stack_ffffffffffffff68),__a);
      local_a2 = areCounterparts(in_stack_00000048,in_stack_00000040,in_stack_00000038);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    if (local_a2 != false) {
      ChannelList::ConstIterator::name((ConstIterator *)0x213d37);
      in_stack_ffffffffffffff30 = ChannelList::ConstIterator::channel((ConstIterator *)0x213d4b);
      ChannelList::insert(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    }
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff30);
  }
  return in_RDI;
}

Assistant:

ChannelList
channelInAllViews (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView)
{
    //
    // Given the name of a channel, return a
    // list of the same channel in all views.
    //

    ChannelList q;

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (i.name () == channelName ||
            areCounterparts (i.name (), channelName, multiView))
        {
            q.insert (i.name (), i.channel ());
        }
    }

    return q;
}